

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O2

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,string *name)

{
  FileError *__return_storage_ptr___00;
  string sStack_248;
  ifstream input;
  int aiStack_208 [122];
  
  ::std::ifstream::ifstream(&input,(string *)name,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(_input + -0x18)) == 0) {
    parse_ini(__return_storage_ptr__,(istream *)&input);
    ::std::ifstream::~ifstream(&input);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&sStack_248,(string *)name);
  FileError::Missing(__return_storage_ptr___00,&sStack_248);
  __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,Error::~Error);
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(const std::string &name) {

    std::ifstream input{name};
    if(!input.good())
        throw FileError::Missing(name);

    return parse_ini(input);
}